

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_login(Curl_easy *data,connectdata *conn)

{
  char *pcVar1;
  char *pcVar2;
  char *local_58;
  char *local_48;
  char *passwd;
  char *user;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->state).aptr.user == (char *)0x0) {
    imap_state(data,IMAP_STOP);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    pcVar1 = imap_atom(conn->user,false);
    pcVar2 = imap_atom(conn->passwd,false);
    local_48 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      local_48 = "";
    }
    local_58 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      local_58 = "";
    }
    data_local._4_4_ = imap_sendf(data,"LOGIN %s %s",local_48,local_58);
    (*Curl_cfree)(pcVar1);
    (*Curl_cfree)(pcVar2);
    if (data_local._4_4_ == CURLE_OK) {
      imap_state(data,IMAP_LOGIN);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_perform_login(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  char *user;
  char *passwd;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we do not */
  if(!data->state.aptr.user) {
    imap_state(data, IMAP_STOP);

    return result;
  }

  /* Make sure the username and password are in the correct atom format */
  user = imap_atom(conn->user, FALSE);
  passwd = imap_atom(conn->passwd, FALSE);

  /* Send the LOGIN command */
  result = imap_sendf(data, "LOGIN %s %s", user ? user : "",
                      passwd ? passwd : "");

  free(user);
  free(passwd);

  if(!result)
    imap_state(data, IMAP_LOGIN);

  return result;
}